

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

uint32_t nghttp2_session_get_remote_settings(nghttp2_session *session,nghttp2_settings_id id)

{
  uint uVar1;
  
  uVar1 = id - NGHTTP2_SETTINGS_HEADER_TABLE_SIZE;
  if ((uVar1 < 9) && ((0x1bfU >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(uint32_t *)
            ((long)&(session->streams).table + *(long *)(&DAT_006fbcc8 + (ulong)uVar1 * 8));
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                ,0x1f47,
                "uint32_t nghttp2_session_get_remote_settings(nghttp2_session *, nghttp2_settings_id)"
               );
}

Assistant:

uint32_t nghttp2_session_get_remote_settings(nghttp2_session *session,
                                             nghttp2_settings_id id) {
  switch (id) {
  case NGHTTP2_SETTINGS_HEADER_TABLE_SIZE:
    return session->remote_settings.header_table_size;
  case NGHTTP2_SETTINGS_ENABLE_PUSH:
    return session->remote_settings.enable_push;
  case NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS:
    return session->remote_settings.max_concurrent_streams;
  case NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE:
    return session->remote_settings.initial_window_size;
  case NGHTTP2_SETTINGS_MAX_FRAME_SIZE:
    return session->remote_settings.max_frame_size;
  case NGHTTP2_SETTINGS_MAX_HEADER_LIST_SIZE:
    return session->remote_settings.max_header_list_size;
  case NGHTTP2_SETTINGS_ENABLE_CONNECT_PROTOCOL:
    return session->remote_settings.enable_connect_protocol;
  case NGHTTP2_SETTINGS_NO_RFC7540_PRIORITIES:
    return session->remote_settings.no_rfc7540_priorities;
  }

  assert(0);
  abort(); /* if NDEBUG is set */
}